

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitLoopStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Loop *loop,Type inputType)

{
  ScopeCtx local_d8;
  Loop *local_28;
  Loop *loop_local;
  IRBuilder *this_local;
  Type inputType_local;
  
  local_28 = loop;
  loop_local = (Loop *)this;
  this_local = (IRBuilder *)inputType.id;
  inputType_local.id = (uintptr_t)__return_storage_ptr__;
  applyDebugLoc(this,(Expression *)loop);
  ScopeCtx::makeLoop(&local_d8,local_28,(Type)this_local);
  pushScope(__return_storage_ptr__,this,&local_d8);
  ScopeCtx::~ScopeCtx(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitLoopStart(Loop* loop, Type inputType) {
  applyDebugLoc(loop);
  return pushScope(ScopeCtx::makeLoop(loop, inputType));
}